

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O3

bool __thiscall QLibraryPrivate::unload(QLibraryPrivate *this,UnloadFlag flag)

{
  QMutex *this_00;
  QAtomicInt *pQVar1;
  __pointer_type copy;
  Data *pDVar2;
  QObject *pQVar3;
  DataPointer *pDVar4;
  undefined8 uVar5;
  bool bVar6;
  storage_type *in_RCX;
  char *pcVar7;
  char16_t *begin;
  QString *this_01;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView ba;
  QByteArrayView ba_00;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p != (__pointer_type)0x0) &&
     (0 < (this->libraryUnloadCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i)) {
    pQVar1 = &this->libraryUnloadCount;
    LOCK();
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      this_00 = &this->mutex;
      if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
        in_RCX = (storage_type *)0x1;
        LOCK();
        bVar8 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
        if (bVar8) {
          (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
        }
        UNLOCK();
        if (!bVar8) goto LAB_00492ae1;
      }
      else {
LAB_00492ae1:
        QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
      }
      pDVar2 = (this->inst).wp.d;
      if (((pDVar2 != (Data *)0x0) &&
          ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
         (pQVar3 = (this->inst).wp.value, pQVar3 != (QObject *)0x0)) {
        (*pQVar3->_vptr_QObject[4])();
      }
      if (flag == NoUnloadSys) {
LAB_00492b20:
        lcDebugLibrary();
        if (((byte)lcDebugLibrary::category.super_QLoggingCategory.field_2.bools.enabledDebug.
                   _q_value._M_base._M_i & 1) != 0) {
          QMessageLogger::debug((QMessageLogger *)local_48);
          begin = (this->fileName).d.ptr;
          if ((QChar *)begin == (QChar *)0x0) {
            begin = &QString::_empty;
          }
          QDebug::putString((QDebug *)local_48,(QChar *)begin,(this->fileName).d.size);
          if (*(bool *)(local_48._0_8_ + 0x30) == true) {
            ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
          }
          uVar5 = local_48._0_8_;
          ba.m_data = in_RCX;
          ba.m_size = (qsizetype)"unloaded library";
          QString::fromUtf8((QString *)(local_48 + 8),(QString *)0x10,ba);
          ::QTextStream::operator<<((QTextStream *)uVar5,(QString *)(local_48 + 8));
          if ((QArrayData *)local_48._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_48._8_8_,2,0x10);
            }
          }
          if (*(bool *)(local_48._0_8_ + 0x30) == true) {
            ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
          }
          uVar5 = local_48._0_8_;
          pcVar7 = "";
          if (flag == NoUnloadSys) {
            pcVar7 = "(faked)";
          }
          this_01 = (QString *)0xffffffffffffffff;
          do {
            pDVar4 = &this_01->d;
            this_01 = (QString *)((long)&(this_01->d).d + 1);
          } while ((pcVar7 + 1)[(long)&pDVar4->d] != '\0');
          ba_00.m_data = in_RCX;
          ba_00.m_size = (qsizetype)pcVar7;
          QString::fromUtf8((QString *)(local_48 + 8),this_01,ba_00);
          ::QTextStream::operator<<((QTextStream *)uVar5,(QString *)(local_48 + 8));
          if ((QArrayData *)local_48._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_48._8_8_,2,0x10);
            }
          }
          if (*(bool *)(local_48._0_8_ + 0x30) == true) {
            ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
          }
          QDebug::~QDebug((QDebug *)local_48);
        }
        LOCK();
        (this->libraryRefCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (this->libraryRefCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        (this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = (__pointer_type)0x0;
        (this->instanceFactory).super_QBasicAtomicPointer<QObject_*()>._q_value._M_b._M_p =
             (__pointer_type)0x0;
        bVar8 = false;
      }
      else {
        bVar6 = unload_sys(this);
        bVar8 = true;
        if (bVar6) goto LAB_00492b20;
      }
      LOCK();
      copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (copy != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
      }
      bVar6 = true;
      if (!bVar8) goto LAB_00492cb6;
    }
  }
  bVar6 = false;
LAB_00492cb6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QLibraryPrivate::unload(UnloadFlag flag)
{
    if (!pHnd.loadRelaxed())
        return false;
    if (libraryUnloadCount.loadRelaxed() > 0 && !libraryUnloadCount.deref()) { // only unload if ALL QLibrary instance wanted to
        QMutexLocker locker(&mutex);
        delete inst.data();
        if (flag == NoUnloadSys || unload_sys()) {
            qCDebug(lcDebugLibrary) << fileName << "unloaded library"
                                    << (flag == NoUnloadSys ? "(faked)" : "");
            // when the library is unloaded, we release the reference on it so that 'this'
            // can get deleted
            libraryRefCount.deref();
            pHnd.storeRelaxed(nullptr);
            instanceFactory.storeRelaxed(nullptr);
            return true;
        }
    }

    return false;
}